

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t expectedTypeExpression_,
          sysbvm_tuple_t environment_,sysbvm_tuple_t sourcePosition_,
          sysbvm_tuple_t *outExpectedCanonicalType)

{
  bool bVar1;
  sysbvm_tuple_t *astNode__00;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sourcePosition;
  sysbvm_astCoerceValueNode_t **coerceNode_1;
  sysbvm_astCoerceValueNode_t **coerceNode;
  undefined1 local_a8 [7];
  _Bool shouldAddCoercionNode;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_64_8_ed890422 gcFrame;
  sysbvm_tuple_t result;
  sysbvm_tuple_t *outExpectedCanonicalType_local;
  sysbvm_tuple_t sourcePosition__local;
  sysbvm_tuple_t environment__local;
  sysbvm_tuple_t expectedTypeExpression__local;
  sysbvm_tuple_t astNode__local;
  sysbvm_context_t *context_local;
  
  if (expectedTypeExpression_ == 0) {
    context_local =
         (sysbvm_context_t *)
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt
                   (context,astNode_,0,environment_,sourcePosition_);
    if (outExpectedCanonicalType != (sysbvm_tuple_t *)0x0) {
      sVar3 = sysbvm_astNode_getAnalyzedType((sysbvm_tuple_t)context_local);
      *outExpectedCanonicalType = sVar3;
    }
  }
  else {
    _Var2 = sysbvm_astNode_isLiteralNode(context,expectedTypeExpression_);
    if (_Var2) {
      if (outExpectedCanonicalType != (sysbvm_tuple_t *)0x0) {
        sVar3 = sysbvm_astLiteralNode_getValue(expectedTypeExpression_);
        *outExpectedCanonicalType = sVar3;
      }
      sVar3 = sysbvm_astLiteralNode_getValue(expectedTypeExpression_);
      context_local =
           (sysbvm_context_t *)
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt
                     (context,astNode_,sVar3,environment_,sourcePosition_);
    }
    else {
      gcFrameRecord.roots = (sysbvm_tuple_t *)astNode_;
      memset(local_a8,0,0x20);
      gcFrameRecord.previous._0_4_ = 0;
      gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP;
      gcFrameRecord._12_4_ = 0;
      gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
      sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_a8);
      sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,expectedTypeExpression_,(context->roots).typeType,environment_);
      if (sVar3 == 0) {
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a8);
        context_local =
             (sysbvm_context_t *)
             sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,(sysbvm_tuple_t)gcFrameRecord.roots,0,environment_);
      }
      else {
        _Var2 = sysbvm_astNode_isLiteralNode(context,sVar3);
        if (_Var2) {
          sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a8);
          astNode__00 = gcFrameRecord.roots;
          sVar3 = sysbvm_astLiteralNode_getValue(sVar3);
          context_local =
               (sysbvm_context_t *)
               sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,(sysbvm_tuple_t)astNode__00,sVar3,environment_);
        }
        else {
          sVar4 = sysbvm_astNode_getAnalyzedType(sVar3);
          sVar4 = sysbvm_type_getCanonicalPendingInstanceType(context,sVar4);
          if (gcFrameRecord.roots == (sysbvm_tuple_t *)0x0) {
            sourcePosition = sysbvm_type_getDefaultValue(context,sVar4);
            gcFrameRecord.roots =
                 (sysbvm_tuple_t *)
                 sysbvm_astLiteralNode_create(context,sourcePosition,sourcePosition_);
          }
          gcFrame.sourcePosition =
               sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                         (context,(sysbvm_tuple_t)gcFrameRecord.roots,environment_);
          bVar1 = true;
          _Var2 = sysbvm_astNode_isCoerceValueNode(context,gcFrame.sourcePosition);
          if (((_Var2) && (*(sysbvm_tuple_t *)(gcFrame.sourcePosition + 0x28) == sVar3)) &&
             (*(sysbvm_tuple_t *)(gcFrame.sourcePosition + 0x20) == sVar4)) {
            bVar1 = false;
          }
          if (bVar1) {
            gcFrame.sourcePosition =
                 sysbvm_astCoerceValueNode_create
                           (context,sourcePosition_,sVar3,gcFrame.sourcePosition);
            *(sysbvm_tuple_t *)(gcFrame.sourcePosition + 0x20) = sVar4;
            sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken
                              (context,environment_);
            *(sysbvm_tuple_t *)(gcFrame.sourcePosition + 0x18) = sVar3;
          }
          if (outExpectedCanonicalType != (sysbvm_tuple_t *)0x0) {
            *outExpectedCanonicalType = sVar4;
          }
          sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a8);
          context_local = (sysbvm_context_t *)gcFrame.sourcePosition;
        }
      }
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t expectedTypeExpression_, sysbvm_tuple_t environment_, sysbvm_tuple_t sourcePosition_, sysbvm_tuple_t *outExpectedCanonicalType)
{
    // Attempt to delegate first.
    if(!expectedTypeExpression_)
    {
        sysbvm_tuple_t result = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt(context, astNode_, SYSBVM_NULL_TUPLE, environment_, sourcePosition_);
        if(outExpectedCanonicalType)
            *outExpectedCanonicalType = sysbvm_astNode_getAnalyzedType(result);
        return result;
    }
    else if(sysbvm_astNode_isLiteralNode(context, expectedTypeExpression_))
    {
        if(outExpectedCanonicalType)
            *outExpectedCanonicalType = sysbvm_astLiteralNode_getValue(expectedTypeExpression_);
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt(context, astNode_, sysbvm_astLiteralNode_getValue(expectedTypeExpression_), environment_, sourcePosition_);
    }

    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t expectedTypeExpression;

        sysbvm_tuple_t analyzedTypeExpression;
        sysbvm_tuple_t analyzedTypeExpressionType;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t environment;
        sysbvm_tuple_t sourcePosition;

        sysbvm_tuple_t result;
    } gcFrame = {
        .astNode = astNode_,
        .expectedTypeExpression = expectedTypeExpression_,
        .environment = environment_,
        .sourcePosition = sourcePosition_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Make sure the type expression is analyzed.
    gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.expectedTypeExpression, context->roots.typeType, environment_);
    if(!gcFrame.analyzedTypeExpression)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.astNode, SYSBVM_NULL_TUPLE, gcFrame.environment);
    }
    else if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.astNode, sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression), gcFrame.environment);
    }

    gcFrame.analyzedTypeExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTypeExpression);
    gcFrame.resultType = sysbvm_type_getCanonicalPendingInstanceType(context, gcFrame.analyzedTypeExpressionType);
    if(!gcFrame.astNode)
        gcFrame.astNode = sysbvm_astLiteralNode_create(context, sysbvm_type_getDefaultValue(context, gcFrame.resultType), gcFrame.sourcePosition);

    // Analyze the value expression.
    gcFrame.result = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.astNode, gcFrame.environment);
    bool shouldAddCoercionNode = true;

    if(sysbvm_astNode_isCoerceValueNode(context, gcFrame.result))
    {
        sysbvm_astCoerceValueNode_t **coerceNode = (sysbvm_astCoerceValueNode_t **)&gcFrame.result;
        if((*coerceNode)->typeExpression == gcFrame.analyzedTypeExpression
        && (*coerceNode)->super.analyzedType == gcFrame.resultType)
            shouldAddCoercionNode = false;
    }

    // Add the coercion node
    if(shouldAddCoercionNode)
    {
        gcFrame.result = sysbvm_astCoerceValueNode_create(context, gcFrame.sourcePosition, gcFrame.analyzedTypeExpression, gcFrame.result);

        sysbvm_astCoerceValueNode_t **coerceNode = (sysbvm_astCoerceValueNode_t **)&gcFrame.result;
        (*coerceNode)->super.analyzedType = gcFrame.resultType;
        (*coerceNode)->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, gcFrame.environment);

    }

    if(outExpectedCanonicalType)
        *outExpectedCanonicalType = gcFrame.resultType;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}